

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

void __thiscall OPL3::Update(OPL3 *this,float *output,int numsamples)

{
  Channel *pCVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int channelNumber;
  long lVar5;
  Channel *(*papCVar6) [9];
  double extraout_XMM0_Qa;
  
  if (numsamples != 0) {
    do {
      if (-1 < this->_new) {
        lVar3 = 0;
        papCVar6 = this->channels;
        do {
          lVar5 = 0;
          do {
            pCVar1 = (*papCVar6)[lVar5];
            if (pCVar1 != &(this->disabledChannel).super_Channel) {
              (*pCVar1->_vptr_Channel[2])(pCVar1,this);
              *output = (float)(pCVar1->leftPan * extraout_XMM0_Qa) + *output;
              output[1] = (float)(extraout_XMM0_Qa * pCVar1->rightPan) + output[1];
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 9);
          papCVar6 = papCVar6 + 1;
          bVar2 = lVar3 < this->_new;
          lVar3 = lVar3 + 1;
        } while (bVar2);
      }
      numsamples = numsamples + -1;
      iVar4 = this->tremoloIndex + 1;
      if (0x347a < this->tremoloIndex) {
        iVar4 = 0;
      }
      this->vibratoIndex = this->vibratoIndex + 1U & 0x1fff;
      this->tremoloIndex = iVar4;
      output = output + 2;
    } while (numsamples != 0);
  }
  return;
}

Assistant:

void OPL3::Update(float *output, int numsamples) {
	while (numsamples--) {
		// If _new = 0, use OPL2 mode with 9 channels. If _new = 1, use OPL3 18 channels;
		for(int array=0; array < (_new + 1); array++)
			for(int channelNumber=0; channelNumber < 9; channelNumber++) {
				// Reads output from each OPL3 channel, and accumulates it in the output buffer:
				Channel *channel = channels[array][channelNumber];
				if (channel != &disabledChannel)
				{
					double channelOutput = channel->getChannelOutput(this);
					output[0] += float(channelOutput * channel->leftPan);
					output[1] += float(channelOutput * channel->rightPan);
				}
			}

		// Advances the OPL3-wide vibrato index, which is used by 
		// PhaseGenerator.getPhase() in each Operator.
		vibratoIndex = (vibratoIndex + 1) & (OPL3DataStruct::vibratoTableLength - 1);
		// Advances the OPL3-wide tremolo index, which is used by 
		// EnvelopeGenerator.getEnvelope() in each Operator.
		tremoloIndex++;
		if(tremoloIndex >= OPL3DataStruct::tremoloTableLength) tremoloIndex = 0;
		output += 2;
	}
}